

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O0

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)1>(void)

{
  StringRef capturedExpression;
  vector_t<CPUType::SSE2,_int> input_00;
  char *pcVar1;
  char *pcVar2;
  longlong (*palVar3) [2];
  AssertionHandler catchAssertionHandler;
  size_t i;
  qvector_t<(intgemm::CPUType)1,_int> result;
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  int LENGTH;
  ITransientExpression *in_stack_fffffffffffffdf8;
  ExprLhs<const_int_&> in_stack_fffffffffffffe00;
  StringRef *in_stack_fffffffffffffe08;
  AlignedVector<int> *in_stack_fffffffffffffe10;
  AssertionHandler *this;
  int *rhs;
  ExprLhs<const_int_&> *in_stack_fffffffffffffe38;
  longlong in_stack_fffffffffffffe60;
  longlong in_stack_fffffffffffffe68;
  AssertionHandler local_e8;
  char *local_80;
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  int *piStack_40;
  AlignedVector<int> local_28;
  AlignedVector<signed_char> local_18;
  undefined4 local_4;
  
  if (0 < kCPU) {
    local_4 = 0x10;
    AlignedVector<signed_char>::AlignedVector
              ((AlignedVector<signed_char> *)in_stack_fffffffffffffe10,
               (size_t)in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00.m_lhs);
    AlignedVector<int>::AlignedVector
              (in_stack_fffffffffffffe10,(size_t)in_stack_fffffffffffffe08,
               (size_t)in_stack_fffffffffffffe00.m_lhs);
    pcVar1 = AlignedVector<signed_char>::begin(&local_18);
    pcVar2 = AlignedVector<signed_char>::end(&local_18);
    std::iota<signed_char*,signed_char>(pcVar1,pcVar2,-8);
    AlignedVector<signed_char>::as<long_long__vector(2)>(&local_18);
    input_00[1] = in_stack_fffffffffffffe68;
    input_00[0] = in_stack_fffffffffffffe60;
    kernels::upcast8to32(input_00);
    palVar3 = AlignedVector<int>::as<long_long__vector(2)>(&local_28);
    (*palVar3)[0] = local_78;
    (*palVar3)[1] = lStack_70;
    palVar3 = AlignedVector<int>::as<long_long__vector(2)>(&local_28);
    palVar3[1][0] = local_68;
    palVar3[1][1] = lStack_60;
    palVar3 = AlignedVector<int>::as<long_long__vector(2)>(&local_28);
    palVar3[2][0] = local_58;
    palVar3[2][1] = lStack_50;
    palVar3 = AlignedVector<int>::as<long_long__vector(2)>(&local_28);
    palVar3[3][0] = local_48;
    palVar3[3][1] = (longlong)piStack_40;
    local_80 = (char *)0x0;
    rhs = piStack_40;
    while (pcVar1 = local_80, pcVar2 = (char *)AlignedVector<int>::size(&local_28), pcVar1 < pcVar2)
    {
      local_e8.m_assertionInfo.lineInfo =
           (SourceLineInfo)
           operator____catch_sr
                     ((char *)in_stack_fffffffffffffe00.m_lhs,(size_t)in_stack_fffffffffffffdf8);
      this = &local_e8;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)this,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
                 ,0x65);
      Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffe08);
      capturedExpression.m_size = (size_type)pcVar2;
      capturedExpression.m_start = pcVar1;
      Catch::AssertionHandler::AssertionHandler
                (this,in_stack_fffffffffffffe08,(SourceLineInfo *)in_stack_fffffffffffffe00.m_lhs,
                 capturedExpression,(Flags)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      in_stack_fffffffffffffe08 =
           (StringRef *)AlignedVector<int>::operator[](&local_28,(size_t)local_80);
      in_stack_fffffffffffffe00 =
           Catch::Decomposer::operator<=((Decomposer *)in_stack_fffffffffffffdf8,(int *)0x289b37);
      in_stack_fffffffffffffdf8 =
           (ITransientExpression *)
           AlignedVector<signed_char>::operator[](&local_18,(size_t)local_80);
      Catch::ExprLhs<int_const&>::operator==(in_stack_fffffffffffffe38,rhs);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffffe00.m_lhs,in_stack_fffffffffffffdf8);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x289bb7);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffe00.m_lhs);
      Catch::AssertionHandler::~AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffe00.m_lhs);
      local_80 = local_80 + 1;
    }
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x289cd2);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x289cdf);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}